

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void ssh_spr_close(Ssh *ssh,SeatPromptResult spr,char *context)

{
  SeatPromptResult spr_00;
  undefined1 auVar1 [24];
  undefined1 auVar2 [28];
  char *pcVar3;
  _func_void_SeatPromptResult_BinarySink_ptr *p_Var4;
  undefined8 uVar5;
  char *ptr;
  char *err;
  char *context_local;
  Ssh *ssh_local;
  
  auVar2 = spr._4_28_;
  spr._4_28_ = auVar2;
  if (spr.kind == SPRK_USER_ABORT) {
    pcVar3 = spr.errdata_lit;
    p_Var4 = spr.errfn;
    uVar5 = spr._24_8_;
    auVar2 = (undefined1  [28])spr._4_28_;
    spr.errfn = p_Var4;
    spr.errdata_lit = pcVar3;
    spr._24_8_ = uVar5;
    ssh_user_close(ssh,"User aborted at %s",context);
  }
  else {
    if (spr.kind != SPRK_SW_ABORT) {
      pcVar3 = spr.errdata_lit;
      p_Var4 = spr.errfn;
      uVar5 = spr._24_8_;
      auVar2 = (undefined1  [28])spr._4_28_;
      spr.errfn = p_Var4;
      spr.errdata_lit = pcVar3;
      spr._24_8_ = uVar5;
      __assert_fail("spr.kind == SPRK_SW_ABORT",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0x47f,"void ssh_spr_close(Ssh *, SeatPromptResult, const char *)");
    }
    auVar1 = spr._8_24_;
    spr_00._24_8_ = &spr;
    spr_00.kind = auVar1._0_4_;
    spr_00._4_4_ = auVar1._4_4_;
    spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)auVar1._8_8_;
    spr_00.errdata_lit = (char *)auVar1._16_8_;
    pcVar3 = spr.errdata_lit;
    p_Var4 = spr.errfn;
    uVar5 = spr._24_8_;
    auVar2 = (undefined1  [28])spr._4_28_;
    spr.errfn = p_Var4;
    spr.errdata_lit = pcVar3;
    spr._24_8_ = uVar5;
    ptr = spr_get_error_message(spr_00);
    auVar2 = (undefined1  [28])spr._4_28_;
    pcVar3 = spr.errdata_lit;
    p_Var4 = spr.errfn;
    uVar5 = spr._24_8_;
    spr._4_28_ = auVar2;
    auVar2 = (undefined1  [28])spr._4_28_;
    spr.errfn = p_Var4;
    spr.errdata_lit = pcVar3;
    spr._24_8_ = uVar5;
    ssh_sw_abort(ssh,"%s",ptr);
    auVar2 = (undefined1  [28])spr._4_28_;
    pcVar3 = spr.errdata_lit;
    p_Var4 = spr.errfn;
    uVar5 = spr._24_8_;
    spr._4_28_ = auVar2;
    auVar2 = (undefined1  [28])spr._4_28_;
    spr.errfn = p_Var4;
    spr.errdata_lit = pcVar3;
    spr._24_8_ = uVar5;
    safefree(ptr);
  }
  return;
}

Assistant:

void ssh_spr_close(Ssh *ssh, SeatPromptResult spr, const char *context)
{
    if (spr.kind == SPRK_USER_ABORT) {
        ssh_user_close(ssh, "User aborted at %s", context);
    } else {
        assert(spr.kind == SPRK_SW_ABORT);
        char *err = spr_get_error_message(spr);
        ssh_sw_abort(ssh, "%s", err);
        sfree(err);
    }
}